

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adfa.h
# Opt level: O0

void __thiscall re2c::State::State(State *this)

{
  label_t lVar1;
  State *this_local;
  
  lVar1 = label_t::first();
  (this->label).value = lVar1.value;
  this->rule = (RuleOp *)0x0;
  this->next = (State *)0x0;
  this->fill = 0;
  this->isPreCtxt = false;
  this->isBase = false;
  Go::Go(&this->go);
  Action::Action(&this->action);
  return;
}

Assistant:

State ()
		: label (label_t::first ())
		, rule (NULL)
		, next (0)
		, fill (0)
		, isPreCtxt (false)
		, isBase (false)
		, go ()
		, action ()
	{}